

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello.cpp
# Opt level: O0

int main(void)

{
  ostream *this;
  undefined1 local_20 [8];
  io_context io_context;
  
  io_context.impl_._4_4_ = 0;
  boost::asio::io_context::io_context((io_context *)local_20);
  boost::asio::io_context::run((io_context *)local_20);
  this = std::operator<<((ostream *)&std::cout,"Hello, World!");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  io_context.impl_._4_4_ = 0;
  boost::asio::io_context::~io_context((io_context *)local_20);
  return io_context.impl_._4_4_;
}

Assistant:

int main() {
  boost::asio::io_context io_context;
  io_context.run();

  std::cout << "Hello, World!" << std::endl;

  return 0;
}